

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O2

double Abc_NtkCountNodes_rec(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  void *pvVar1;
  uint uVar2;
  int i;
  int iVar3;
  double dVar4;
  double local_28;
  
  local_28 = 0.0;
  dVar4 = pNtk->dTemp;
  if (pNtk->dTemp < 0.0) {
    p = Abc_NtkDfsBoxes(pNtk);
    iVar3 = p->nSize;
    i = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
      i = 0;
    }
    for (; iVar3 != i; i = i + 1) {
      pvVar1 = Vec_PtrEntry(p,i);
      uVar2 = *(uint *)((long)pvVar1 + 0x14) & 0xf;
      if (uVar2 == 7) {
        local_28 = local_28 + 1.0;
      }
      else if (((*(uint *)((long)pvVar1 + 0x14) & 0xe) == 8 || uVar2 == 10) &&
              (*(Abc_Ntk_t **)((long)pvVar1 + 0x38) != pNtk)) {
        dVar4 = Abc_NtkCountNodes_rec(*(Abc_Ntk_t **)((long)pvVar1 + 0x38));
        local_28 = local_28 + dVar4;
      }
    }
    Vec_PtrFree(p);
    pNtk->dTemp = local_28;
    dVar4 = local_28;
  }
  return dVar4;
}

Assistant:

double Abc_NtkCountNodes_rec( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vOrder;
    Abc_Obj_t * pObj;
    double Counter = 0;
    int i;
    if ( pNtk->dTemp >= 0 )
        return pNtk->dTemp;
    vOrder = Abc_NtkDfsBoxes( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
        if ( Abc_ObjIsNode(pObj) )
            Counter++;
        else if ( Abc_ObjIsBox(pObj) && (Abc_Ntk_t *)pObj->pData != pNtk )
            Counter += Abc_NtkCountNodes_rec( (Abc_Ntk_t *)pObj->pData );
    Vec_PtrFree( vOrder );
    return pNtk->dTemp = Counter;
}